

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netrc.c
# Opt level: O1

int Curl_parsenetrc(char *host,char **loginp,char **passwordp,_Bool *login_changed,
                   _Bool *password_changed,char *netrcfile)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  __uid_t __uid;
  uint uVar5;
  int iVar6;
  FILE *__stream;
  char *pcVar7;
  char *__s1;
  char cVar8;
  char *first;
  bool bVar9;
  bool bVar10;
  passwd *pw_res;
  passwd pw;
  char pwbuf [1024];
  int local_10d0;
  int local_10b4;
  char *local_10b0;
  passwd *local_1070;
  passwd local_1068;
  char local_1038 [4104];
  
  __s1 = *loginp;
  if (__s1 == (char *)0x0) {
    bVar10 = false;
  }
  else {
    bVar10 = *__s1 != '\0';
  }
  local_10b0 = *passwordp;
  if (netrcfile != (char *)0x0) {
    bVar9 = false;
    goto LAB_001227fd;
  }
  pcVar7 = curl_getenv("HOME");
  if (pcVar7 == (char *)0x0) {
    __uid = geteuid();
    iVar6 = getpwuid_r(__uid,&local_1068,local_1038,0x400,&local_1070);
    bVar9 = local_1070 != (passwd *)0x0 && iVar6 == 0;
    if (local_1070 != (passwd *)0x0 && iVar6 == 0) {
      pcVar7 = (*Curl_cstrdup)(local_1068.pw_dir);
      if (pcVar7 == (char *)0x0) {
        bVar9 = false;
        pcVar7 = (char *)0x0;
        bVar1 = false;
      }
      else {
        bVar9 = true;
        bVar1 = true;
      }
    }
    else {
      bVar1 = true;
      pcVar7 = (char *)0x0;
    }
    if (bVar1) goto LAB_00122798;
    uVar5 = 0x1b;
LAB_001227ef:
    netrcfile = (char *)0x0;
    bVar9 = false;
  }
  else {
    bVar9 = true;
LAB_00122798:
    if (pcVar7 == (char *)0x0) {
      uVar5 = 1;
      goto LAB_001227ef;
    }
    netrcfile = curl_maprintf("%s%s%s",pcVar7,"/",".netrc");
    if (bVar9) {
      (*Curl_cfree)(pcVar7);
    }
    bVar9 = netrcfile != (char *)0x0;
    uVar5 = -(uint)(netrcfile == (char *)0x0) | 0x1b;
  }
  if (!bVar9) {
    return uVar5;
  }
LAB_001227fd:
  __stream = fopen64(netrcfile,"r");
  if (bVar9) {
    (*Curl_cfree)(netrcfile);
  }
  if (__stream == (FILE *)0x0) {
    local_10d0 = 1;
  }
  else {
    local_10d0 = 1;
    bVar4 = false;
    local_10b4 = 0;
    bVar9 = false;
    bVar1 = false;
    cVar8 = '\0';
    bVar3 = false;
    bVar2 = false;
LAB_0012287c:
    do {
      pcVar7 = fgets(local_1038,0x1000,__stream);
      if (pcVar7 == (char *)0x0) break;
      pcVar7 = strtok_r(local_1038," \t\n",&local_1068.pw_name);
      if (pcVar7 != (char *)0x0) {
        if (*pcVar7 == '#') goto LAB_0012287c;
        do {
          if (((__s1 != (char *)0x0) && (local_10b0 != (char *)0x0 && *__s1 != '\0')) &&
             (*local_10b0 != '\0')) {
            bVar4 = true;
            break;
          }
          if (cVar8 == '\x02') {
            if (bVar1) {
              if (bVar10) {
                local_10b4 = Curl_strcasecompare(__s1,pcVar7);
              }
              else if ((__s1 == (char *)0x0) || (iVar6 = strcmp(__s1,pcVar7), iVar6 != 0)) {
                if (bVar2) {
                  (*Curl_cfree)(__s1);
                  bVar2 = false;
                }
                __s1 = (*Curl_cstrdup)(pcVar7);
                if (__s1 != (char *)0x0) {
                  bVar1 = false;
                  cVar8 = '\x02';
                  bVar2 = true;
                  goto LAB_00122ae8;
                }
                local_10d0 = -1;
                __s1 = (char *)0x0;
                goto LAB_00122b2f;
              }
              cVar8 = '\x02';
              bVar1 = false;
            }
            else {
              if (bVar9) {
                cVar8 = '\x02';
                if (((bool)(bVar10 & local_10b4 == 0)) ||
                   ((local_10b0 != (char *)0x0 && (iVar6 = strcmp(local_10b0,pcVar7), iVar6 == 0))))
                {
                  bVar1 = false;
                }
                else {
                  if (bVar3) {
                    (*Curl_cfree)(local_10b0);
                    bVar3 = false;
                  }
                  local_10b0 = (*Curl_cstrdup)(pcVar7);
                  if (local_10b0 == (char *)0x0) {
                    local_10d0 = -1;
                    local_10b0 = (char *)0x0;
                    goto LAB_00122b2f;
                  }
                  bVar1 = false;
                  bVar3 = true;
                }
              }
              else {
                iVar6 = Curl_strcasecompare("login",pcVar7);
                cVar8 = '\x02';
                if (iVar6 == 0) {
                  iVar6 = Curl_strcasecompare("password",pcVar7);
                  if (iVar6 != 0) {
                    bVar1 = false;
                    bVar9 = true;
                    goto LAB_00122ae8;
                  }
                  iVar6 = Curl_strcasecompare("machine",pcVar7);
                  bVar1 = false;
                  if (iVar6 != 0) {
                    local_10b4 = 0;
                  }
                  cVar8 = (iVar6 == 0) + '\x01';
                }
                else {
                  bVar1 = true;
                }
              }
              bVar9 = false;
            }
          }
          else {
            first = host;
            if (cVar8 != '\x01') {
              iVar6 = Curl_strcasecompare("machine",pcVar7);
              cVar8 = '\x01';
              if (iVar6 != 0) goto LAB_00122ae8;
              first = "default";
            }
            iVar6 = Curl_strcasecompare(first,pcVar7);
            if (iVar6 != 0) {
              local_10d0 = 0;
            }
            cVar8 = (iVar6 != 0) * '\x02';
          }
LAB_00122ae8:
          pcVar7 = strtok_r((char *)0x0," \t\n",&local_1068.pw_name);
        } while (pcVar7 != (char *)0x0);
      }
    } while (!bVar4);
LAB_00122b2f:
    if (local_10d0 == 0) {
      *login_changed = false;
      *password_changed = false;
      if (bVar2) {
        if (*loginp != (char *)0x0) {
          (*Curl_cfree)(*loginp);
        }
        *loginp = __s1;
        *login_changed = true;
      }
      if (bVar3) {
        if (*passwordp != (char *)0x0) {
          (*Curl_cfree)(*passwordp);
        }
        *passwordp = local_10b0;
        *password_changed = true;
      }
    }
    else {
      if (bVar2) {
        (*Curl_cfree)(__s1);
      }
      if (bVar3) {
        (*Curl_cfree)(local_10b0);
      }
    }
    fclose(__stream);
  }
  return local_10d0;
}

Assistant:

int Curl_parsenetrc(const char *host,
                    char **loginp,
                    char **passwordp,
                    bool *login_changed,
                    bool *password_changed,
                    char *netrcfile)
{
  FILE *file;
  int retcode = 1;
  char *login = *loginp;
  char *password = *passwordp;
  bool specific_login = (login && *login != 0);
  bool login_alloc = FALSE;
  bool password_alloc = FALSE;
  bool netrc_alloc = FALSE;
  enum host_lookup_state state = NOTHING;

  char state_login = 0;      /* Found a login keyword */
  char state_password = 0;   /* Found a password keyword */
  int state_our_login = FALSE;  /* With specific_login, found *our* login
                                   name */

#define NETRC DOT_CHAR "netrc"

  if(!netrcfile) {
    bool home_alloc = FALSE;
    char *home = curl_getenv("HOME"); /* portable environment reader */
    if(home) {
      home_alloc = TRUE;
#if defined(HAVE_GETPWUID_R) && defined(HAVE_GETEUID)
    }
    else {
      struct passwd pw, *pw_res;
      char pwbuf[1024];
      if(!getpwuid_r(geteuid(), &pw, pwbuf, sizeof(pwbuf), &pw_res)
         && pw_res) {
        home = strdup(pw.pw_dir);
        if(!home)
          return CURLE_OUT_OF_MEMORY;
        home_alloc = TRUE;
      }
#elif defined(HAVE_GETPWUID) && defined(HAVE_GETEUID)
    }
    else {
      struct passwd *pw;
      pw = getpwuid(geteuid());
      if(pw) {
        home = pw->pw_dir;
      }
#endif
    }

    if(!home)
      return retcode; /* no home directory found (or possibly out of memory) */

    netrcfile = curl_maprintf("%s%s%s", home, DIR_CHAR, NETRC);
    if(home_alloc)
      free(home);
    if(!netrcfile) {
      return -1;
    }
    netrc_alloc = TRUE;
  }

  file = fopen(netrcfile, FOPEN_READTEXT);
  if(netrc_alloc)
    free(netrcfile);
  if(file) {
    char *tok;
    char *tok_buf;
    bool done = FALSE;
    char netrcbuffer[4096];
    int  netrcbuffsize = (int)sizeof(netrcbuffer);

    while(!done && fgets(netrcbuffer, netrcbuffsize, file)) {
      tok = strtok_r(netrcbuffer, " \t\n", &tok_buf);
      if(tok && *tok == '#')
        /* treat an initial hash as a comment line */
        continue;
      while(!done && tok) {

        if((login && *login) && (password && *password)) {
          done = TRUE;
          break;
        }

        switch(state) {
        case NOTHING:
          if(strcasecompare("machine", tok)) {
            /* the next tok is the machine name, this is in itself the
               delimiter that starts the stuff entered for this machine,
               after this we need to search for 'login' and
               'password'. */
            state = HOSTFOUND;
          }
          else if(strcasecompare("default", tok)) {
            state = HOSTVALID;
            retcode = 0; /* we did find our host */
          }
          break;
        case HOSTFOUND:
          if(strcasecompare(host, tok)) {
            /* and yes, this is our host! */
            state = HOSTVALID;
            retcode = 0; /* we did find our host */
          }
          else
            /* not our host */
            state = NOTHING;
          break;
        case HOSTVALID:
          /* we are now parsing sub-keywords concerning "our" host */
          if(state_login) {
            if(specific_login) {
              state_our_login = strcasecompare(login, tok);
            }
            else if(!login || strcmp(login, tok)) {
              if(login_alloc) {
                free(login);
                login_alloc = FALSE;
              }
              login = strdup(tok);
              if(!login) {
                retcode = -1; /* allocation failed */
                goto out;
              }
              login_alloc = TRUE;
            }
            state_login = 0;
          }
          else if(state_password) {
            if((state_our_login || !specific_login)
                && (!password || strcmp(password, tok))) {
              if(password_alloc) {
                free(password);
                password_alloc = FALSE;
              }
              password = strdup(tok);
              if(!password) {
                retcode = -1; /* allocation failed */
                goto out;
              }
              password_alloc = TRUE;
            }
            state_password = 0;
          }
          else if(strcasecompare("login", tok))
            state_login = 1;
          else if(strcasecompare("password", tok))
            state_password = 1;
          else if(strcasecompare("machine", tok)) {
            /* ok, there's machine here go => */
            state = HOSTFOUND;
            state_our_login = FALSE;
          }
          break;
        } /* switch (state) */

        tok = strtok_r(NULL, " \t\n", &tok_buf);
      } /* while(tok) */
    } /* while fgets() */

    out:
    if(!retcode) {
      *login_changed = FALSE;
      *password_changed = FALSE;
      if(login_alloc) {
        if(*loginp)
          free(*loginp);
        *loginp = login;
        *login_changed = TRUE;
      }
      if(password_alloc) {
        if(*passwordp)
          free(*passwordp);
        *passwordp = password;
        *password_changed = TRUE;
      }
    }
    else {
      if(login_alloc)
        free(login);
      if(password_alloc)
        free(password);
    }
    fclose(file);
  }

  return retcode;
}